

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O2

btScalar btShortestAngleUpdate(btScalar accAngle,btScalar curAngle)

{
  btScalar bVar1;
  btScalar bVar2;
  
  bVar1 = btNormalizeAnglePositive(curAngle);
  bVar2 = btNormalizeAnglePositive(accAngle);
  bVar1 = btNormalizeAnglePositive(bVar1 - bVar2);
  bVar1 = btNormalizeAngle(bVar1);
  return (btScalar)
         (-(uint)(0.3 < ABS(bVar1)) & (uint)curAngle |
         ~-(uint)(0.3 < ABS(bVar1)) & (uint)(bVar1 + accAngle));
}

Assistant:

static btScalar btShortestAngleUpdate(btScalar accAngle, btScalar curAngle)
{
	btScalar tol(0.3);
	btScalar result = btShortestAngularDistance(accAngle, curAngle);

	  if (btFabs(result) > tol)
		return curAngle;
	  else
		return accAngle + result;

	return curAngle;
}